

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RoboSimian.cpp
# Opt level: O0

shared_ptr<chrono::ChMaterialSurface> __thiscall
chrono::robosimian::DefaultContactMaterial(robosimian *this,ChContactMethod contact_method)

{
  element_type *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  shared_ptr<chrono::ChMaterialSurface> sVar3;
  undefined1 local_68 [8];
  shared_ptr<chrono::ChMaterialSurfaceSMC> matSMC;
  undefined1 local_48 [8];
  shared_ptr<chrono::ChMaterialSurfaceNSC> matNSC;
  float gt;
  float kt;
  float gn;
  float kn;
  float nu;
  float Y;
  float cr;
  float mu;
  ChContactMethod contact_method_local;
  
  matNSC.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = 20.0;
  if (contact_method == NSC) {
    chrono_types::make_shared<chrono::ChMaterialSurfaceNSC,_0>();
    std::__shared_ptr_access<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_48);
    chrono::ChMaterialSurface::SetFriction(0.8);
    this_00 = std::
              __shared_ptr_access<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_48);
    ChMaterialSurface::SetRestitution((ChMaterialSurface *)this_00,0.0);
    std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr<chrono::ChMaterialSurfaceNSC,void>
              ((shared_ptr<chrono::ChMaterialSurface> *)this,
               (shared_ptr<chrono::ChMaterialSurfaceNSC> *)local_48);
    std::shared_ptr<chrono::ChMaterialSurfaceNSC>::~shared_ptr
              ((shared_ptr<chrono::ChMaterialSurfaceNSC> *)local_48);
    _Var2._M_pi = extraout_RDX;
  }
  else if (contact_method == SMC) {
    chrono_types::make_shared<chrono::ChMaterialSurfaceSMC,_0>();
    std::__shared_ptr_access<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
    ::operator->((__shared_ptr_access<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)local_68);
    chrono::ChMaterialSurface::SetFriction(0.8);
    peVar1 = std::
             __shared_ptr_access<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
    ChMaterialSurface::SetRestitution((ChMaterialSurface *)peVar1,0.0);
    peVar1 = std::
             __shared_ptr_access<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
    ChMaterialSurfaceSMC::SetYoungModulus(peVar1,2e+07);
    peVar1 = std::
             __shared_ptr_access<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
    ChMaterialSurfaceSMC::SetPoissonRatio(peVar1,0.3);
    peVar1 = std::
             __shared_ptr_access<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
    ChMaterialSurfaceSMC::SetKn(peVar1,200000.0);
    peVar1 = std::
             __shared_ptr_access<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
    ChMaterialSurfaceSMC::SetGn(peVar1,40.0);
    peVar1 = std::
             __shared_ptr_access<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
    ChMaterialSurfaceSMC::SetKt(peVar1,200000.0);
    peVar1 = std::
             __shared_ptr_access<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_68);
    ChMaterialSurfaceSMC::SetGt
              (peVar1,matNSC.
                      super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi._4_4_);
    std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr<chrono::ChMaterialSurfaceSMC,void>
              ((shared_ptr<chrono::ChMaterialSurface> *)this,
               (shared_ptr<chrono::ChMaterialSurfaceSMC> *)local_68);
    std::shared_ptr<chrono::ChMaterialSurfaceSMC>::~shared_ptr
              ((shared_ptr<chrono::ChMaterialSurfaceSMC> *)local_68);
    _Var2._M_pi = extraout_RDX_00;
  }
  else {
    std::shared_ptr<chrono::ChMaterialSurface>::shared_ptr
              ((shared_ptr<chrono::ChMaterialSurface> *)this);
    _Var2._M_pi = extraout_RDX_01;
  }
  sVar3.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar3.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chrono::ChMaterialSurface>)
         sVar3.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ChMaterialSurface> DefaultContactMaterial(ChContactMethod contact_method) {
    float mu = 0.8f;   // coefficient of friction
    float cr = 0.0f;   // coefficient of restitution
    float Y = 2e7f;    // Young's modulus
    float nu = 0.3f;   // Poisson ratio
    float kn = 2e5f;   // normal stiffness
    float gn = 40.0f;  // normal viscous damping
    float kt = 2e5f;   // tangential stiffness
    float gt = 20.0f;  // tangential viscous damping

    switch (contact_method) {
        case ChContactMethod::NSC: {
            auto matNSC = chrono_types::make_shared<ChMaterialSurfaceNSC>();
            matNSC->SetFriction(mu);
            matNSC->SetRestitution(cr);
            return matNSC;
        }
        case ChContactMethod::SMC: {
            auto matSMC = chrono_types::make_shared<ChMaterialSurfaceSMC>();
            matSMC->SetFriction(mu);
            matSMC->SetRestitution(cr);
            matSMC->SetYoungModulus(Y);
            matSMC->SetPoissonRatio(nu);
            matSMC->SetKn(kn);
            matSMC->SetGn(gn);
            matSMC->SetKt(kt);
            matSMC->SetGt(gt);
            return matSMC;
        }
        default:
            return std::shared_ptr<ChMaterialSurface>();
    }
}